

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool P_IsTIDUsed(int tid)

{
  AActor *pAVar1;
  bool bVar2;
  
  pAVar1 = AActor::TIDHash[tid & 0x7f];
  if (pAVar1 == (AActor *)0x0) {
    return false;
  }
  do {
    bVar2 = pAVar1->tid == tid;
    if (bVar2) {
      return bVar2;
    }
    pAVar1 = pAVar1->inext;
  } while (pAVar1 != (AActor *)0x0);
  return bVar2;
}

Assistant:

bool P_IsTIDUsed(int tid)
{
	AActor *probe = AActor::TIDHash[tid & 127];
	while (probe != NULL)
	{
		if (probe->tid == tid)
		{
			return true;
		}
		probe = probe->inext;
	}
	return false;
}